

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineState.h
# Opt level: O0

void __thiscall
Diligent::RayTracingPipelineStateCreateInfo::RayTracingPipelineStateCreateInfo
          (RayTracingPipelineStateCreateInfo *this)

{
  RayTracingPipelineStateCreateInfo *this_local;
  
  PipelineStateCreateInfo::PipelineStateCreateInfo(&this->super_PipelineStateCreateInfo);
  RayTracingPipelineDesc::RayTracingPipelineDesc(&this->RayTracingPipeline);
  this->pGeneralShaders = (RayTracingGeneralShaderGroup *)0x0;
  this->GeneralShaderCount = 0;
  this->pTriangleHitShaders = (RayTracingTriangleHitShaderGroup *)0x0;
  this->TriangleHitShaderCount = 0;
  this->pProceduralHitShaders = (RayTracingProceduralHitShaderGroup *)0x0;
  this->ProceduralHitShaderCount = 0;
  this->pShaderRecordName = (Char *)0x0;
  this->MaxAttributeSize = 0;
  this->MaxPayloadSize = 0;
  (this->super_PipelineStateCreateInfo).PSODesc.PipelineType = PIPELINE_TYPE_RAY_TRACING;
  return;
}

Assistant:

RayTracingPipelineStateCreateInfo() noexcept
    {
        PSODesc.PipelineType = PIPELINE_TYPE_RAY_TRACING;
    }